

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

void pty_real_select_result(Pty *pty,int fd,int event,int status)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  __pid_t _Var4;
  int extraout_EAX;
  char **ppcVar5;
  int *piVar6;
  size_t sVar7;
  Pty *pty_00;
  long lVar8;
  Conf *pCVar9;
  ssize_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  Backend *pBVar15;
  undefined4 in_register_0000000c;
  undefined8 uVar16;
  char **ppcVar17;
  long lVar18;
  Conf *oldconf;
  char *pcVar19;
  undefined8 *puVar20;
  Seat *pSVar21;
  undefined8 *puVar22;
  long in_R8;
  uint in_R9D;
  uint uVar23;
  PtyFd *e;
  ulong uVar24;
  uint uVar25;
  PtyFd *e_00;
  long *plVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  char buf [4096];
  undefined8 auStackY_15f0 [161];
  undefined4 uStackY_10e8;
  char cStackY_10d5;
  uint uStackY_10d4;
  char *pcStackY_10d0;
  Backend *pBStackY_10c8;
  long lStackY_10c0;
  char *pcStackY_10b8;
  Seat *pSStackY_10b0;
  Pty *pPStackY_10a8;
  char **ppcStackY_10a0;
  termios tStackY_1094;
  Pty *pPStackY_1058;
  undefined1 auStackY_1028 [4];
  int in_stack_ffffffffffffefdc;
  undefined8 auStack_1020 [161];
  undefined4 uStack_b18;
  char *pcStack_b10;
  undefined8 *puStack_b08;
  
  uVar16 = CONCAT44(in_register_0000000c,status);
  bVar29 = 0;
  if (event < 0) {
    if (((status & 0x7fU) != 0) && ((int)((status & 0x7fU) * 0x1000000 + 0x1000000) < 0x2000000)) {
      return;
    }
    pty->child_dead = true;
    del234(ptys_by_pid,pty);
    pty->exit_code = status;
    if (pty->master_fd < 0) {
      return;
    }
LAB_0011310d:
    if (pty->finished != false) {
      return;
    }
    lVar8 = 0x28;
    do {
      if (-1 < *(int *)((long)pty->pipefds + lVar8 + -0x10)) {
        uxsel_del(in_stack_ffffffffffffefdc);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x58);
    pty_close(pty);
    pty->finished = true;
    iVar3 = conf_get_int(pty->conf,4);
    if ((iVar3 == 1) || ((iVar3 == 2 && (pty->exit_code != 0)))) {
      uVar23 = pty->exit_code & 0x7f;
      if (uVar23 == 0) {
        pcVar11 = dupprintf("\r\n[pterm: process terminated with exit code %d]\r\n");
      }
      else if ((int)(uVar23 * 0x1000000 + 0x1000000) < 0x2000000) {
        pcVar11 = dupprintf("\r\n[pterm: process terminated]\r\n");
      }
      else {
        pcVar11 = strsignal(uVar23);
        pcVar11 = dupprintf("\r\n[pterm: process terminated on signal %d (%s)]\r\n",(ulong)uVar23,
                            pcVar11);
      }
      pSVar21 = pty->seat;
      sVar14 = strlen(pcVar11);
      (*pSVar21->vt->output)(pSVar21,SEAT_OUTPUT_STDOUT,pcVar11,sVar14);
      safefree(pcVar11);
    }
    (*pty->seat->vt->eof)(pty->seat);
    (*pty->seat->vt->notify_remote_exit)(pty->seat);
    return;
  }
  if (event == 2) {
    pty_try_write(pty);
    return;
  }
  if (event != 1) {
    return;
  }
  pSVar21 = (Seat *)(ulong)(uint)fd;
  iVar3 = pty->master_o;
  ppcVar5 = (char **)read(fd,auStackY_1028,0x1000);
  bVar27 = pty->master_fd != fd;
  bVar28 = -1 < (int)ppcVar5;
  ppcVar17 = (char **)CONCAT71((int7)((ulong)uVar16 >> 8),bVar28 || bVar27);
  if (!bVar28 && !bVar27) {
    piVar6 = __errno_location();
    ppcVar17 = (char **)0x0;
    ppcVar5 = (char **)((ulong)ppcVar5 & 0xffffffff);
    if (*piVar6 == 5) {
      ppcVar5 = ppcVar17;
    }
  }
  if ((int)ppcVar5 == 0) {
    uxsel_del(in_stack_ffffffffffffefdc);
    close(fd);
    if (pty->master_fd == fd) {
      pty->master_fd = -1;
    }
    if (pty->master_o == fd) {
      pty->master_o = -1;
    }
    if (pty->master_e == fd) {
      pty->master_e = -1;
    }
    if (iVar3 != fd) {
      return;
    }
    pty_try_wait();
    if (pty->child_dead == false) {
      pty->exit_code = 0;
    }
    goto LAB_0011310d;
  }
  if (-1 < (int)ppcVar5) {
    sVar7 = (*pty->seat->vt->output)
                      (pty->seat,(uint)(iVar3 != fd),auStackY_1028,(ulong)ppcVar5 & 0xffffffff);
    pty->output_backlog = sVar7;
    pty_uxsel_setup(pty);
    return;
  }
  pty_real_select_result_cold_1();
  e = (PtyFd *)(ulong)in_R9D;
  pSStackY_10b0 = pSVar21;
  pPStackY_1058 = pty;
  (*pSVar21->vt->set_trust_status)(pSVar21,false);
  if (single_pty == (Pty *)0x0) {
    pty_00 = (Pty *)safemalloc(1,0x10d0,0);
    memset(pty_00,0,0x10d0);
    bufchain_init(&pty_00->output_data);
    pty_00->master_fd = -1;
    pty_00->slave_fd = -1;
    pty_stamped_utmp = 0;
  }
  else {
    pty_00 = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  pty_00->pipefds[0] = -1;
  pty_00->pipefds[1] = -1;
  pty_00->pipefds[2] = -1;
  pty_00->pipefds[3] = -1;
  pty_00->pipefds[4] = -1;
  pty_00->pipefds[5] = -1;
  lVar8 = 0x30;
  do {
    *(undefined4 *)((long)pty_00->pipefds + lVar8 + -0x18) = 0xffffffff;
    *(Pty **)((long)pty_00->pipefds + lVar8 + -0x10) = pty_00;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x60);
  if (pty_signal_pipe[0] < 0) {
    iVar3 = pipe(pty_signal_pipe);
    if (-1 < iVar3) {
      cloexec(pty_signal_pipe[0]);
      cloexec(pty_signal_pipe[1]);
      goto LAB_001133aa;
    }
LAB_00113a52:
    pty_backend_create_cold_5();
    iVar3 = extraout_EAX;
  }
  else {
LAB_001133aa:
    pty_00->seat = pSStackY_10b0;
    (pty_00->backend).vt = &pty_backend;
    pCVar9 = conf_copy(oldconf);
    pty_00->conf = pCVar9;
    iVar3 = conf_get_int(oldconf,0x7d);
    pty_00->term_width = iVar3;
    iVar3 = conf_get_int(oldconf,0x7e);
    pty_00->term_height = iVar3;
    if (ptyfds == (tree234 *)0x0) {
      ptyfds = newtree234(ptyfd_compare);
    }
    pBStackY_10c8 = &pty_00->backend;
    iVar3 = pty_00->master_fd;
    uStackY_10d4 = in_R9D;
    lStackY_10c0 = in_R8;
    ppcStackY_10a0 = ppcVar17;
    if ((char)in_R9D == '\0') {
      if (iVar3 < 0) {
        pty_open_master(pty_00);
      }
      if (-1 < pty_utmp_helper_pipe) {
        _Var2 = conf_get_bool(oldconf,0xc4);
        if (_Var2) {
          pcStackY_10d0 = (*pty_00->seat->vt->get_x_display)(pty_00->seat);
          sVar14 = strlen(pcStackY_10d0);
          uVar23 = (int)sVar14 + 1;
          e = (PtyFd *)(ulong)uVar23;
          uVar25 = 0;
          do {
            if (uVar23 - uVar25 == 0 || (int)uVar23 < (int)uVar25) break;
            sVar10 = write(pty_utmp_helper_pipe,pcStackY_10d0 + uVar25,(long)(int)(uVar23 - uVar25))
            ;
            iVar3 = (int)sVar10;
            if (iVar3 < 0) {
              pty_backend_create_cold_1();
            }
            else {
              uVar25 = uVar25 + iVar3;
            }
          } while (-1 < iVar3);
        }
        else {
          close(pty_utmp_helper_pipe);
          pty_utmp_helper_pipe = -1;
        }
      }
      iVar3 = pty_00->master_fd;
      pty_00->master_i = iVar3;
      pty_00->master_o = iVar3;
      pty_00->master_e = -1;
      e_00 = pty_00->fds;
      pty_00->fds[0].fd = iVar3;
    }
    else {
      if ((-1 < iVar3) && (close(iVar3), -1 < pty_utmp_helper_pipe)) {
        close(pty_utmp_helper_pipe);
        pty_utmp_helper_pipe = -1;
      }
      piVar6 = pty_00->pipefds;
      uVar24 = 0xfffffffffffffffe;
      do {
        iVar3 = pipe(piVar6);
        if (iVar3 < 0) {
          (*pBStackY_10c8->vt->free)(pBStackY_10c8);
          return;
        }
        uVar24 = uVar24 + 2;
        piVar6 = piVar6 + 2;
      } while (uVar24 < 4);
      iVar3 = pty_00->pipefds[1];
      iVar1 = pty_00->pipefds[2];
      pty_00->master_i = iVar3;
      pty_00->fds[0].fd = iVar3;
      pty_00->master_o = iVar1;
      e = pty_00->fds + 1;
      pty_00->fds[1].fd = iVar1;
      iVar3 = pty_00->pipefds[4];
      pty_00->master_e = iVar3;
      e_00 = pty_00->fds + 2;
      pty_00->fds[2].fd = iVar3;
      add234(ptyfds,pty_00->fds);
      add234(ptyfds,e);
    }
    in_R9D = (uint)e;
    add234(ptyfds,e_00);
    if (pty_setup_sigchld_handler_setup == '\0') {
      putty_signal(0x11,sigchld_handler);
      pty_setup_sigchld_handler_setup = '\x01';
    }
    _Var4 = fork();
    plVar26 = _environ;
    if (_Var4 < 0) {
      pty_backend_create_cold_4();
    }
    else {
      if (_Var4 != 0) {
        pty_00->child_pid = _Var4;
        pty_00->child_dead = false;
        pty_00->finished = false;
        if (0 < pty_00->slave_fd) {
          close(pty_00->slave_fd);
        }
        if (ptys_by_pid == (tree234 *)0x0) {
          ptys_by_pid = newtree234(pty_compare_by_pid);
        }
        if (-1 < pty_00->pipefds[0]) {
          close(pty_00->pipefds[0]);
          pty_00->pipefds[0] = -1;
        }
        if (-1 < pty_00->pipefds[3]) {
          close(pty_00->pipefds[3]);
          pty_00->pipefds[3] = -1;
        }
        if (-1 < pty_00->pipefds[5]) {
          close(pty_00->pipefds[5]);
          pty_00->pipefds[5] = -1;
        }
        add234(ptys_by_pid,pty_00);
        pty_uxsel_setup(pty_00);
        return;
      }
      pPStackY_10a8 = pty_00;
      if ((pty_osx_envrestore_prefix != (char *)0x0) &&
         (pcVar11 = (char *)*_environ, pcVar11 != (char *)0x0)) {
        sVar14 = strlen(pty_osx_envrestore_prefix);
        pcStackY_10d0 = (char *)(long)(int)sVar14;
        do {
          iVar3 = strncmp(pcVar11,pty_osx_envrestore_prefix,(size_t)pcStackY_10d0);
          if (iVar3 == 0) {
            cStackY_10d5 = pcVar11[(long)pcStackY_10d0];
            sVar14 = strcspn(pcVar11,"=");
            pBVar15 = (Backend *)dupprintf("%.*s",sVar14 & 0xffffffff,pcVar11);
            sVar14 = strcspn(pcVar11,"=");
            pcVar11 = dupstr(pcVar11 + ((sVar14 + 1) - (ulong)(pcVar11[sVar14] == '\0')));
            pBStackY_10c8 = pBVar15;
            if (cStackY_10d5 == 'u') {
              unsetenv(pcStackY_10d0 + (long)pBVar15 + 1);
            }
            else {
              setenv(pcStackY_10d0 + (long)pBVar15 + 1,pcVar11,1);
            }
            pBVar15 = pBStackY_10c8;
            unsetenv((char *)pBStackY_10c8);
            safefree(pBVar15);
            safefree(pcVar11);
            pcVar11 = (char *)*_environ;
            pty_00 = pPStackY_10a8;
            plVar26 = _environ;
          }
          else {
            pcVar11 = (char *)plVar26[1];
            plVar26 = plVar26 + 1;
          }
        } while (pcVar11 != (char *)0x0);
      }
      in_R9D = getpid();
      if ((char)uStackY_10d4 != '\0') {
        pty_backend_create_cold_3();
        lVar8 = lStackY_10c0;
        goto LAB_001136f8;
      }
    }
    iVar3 = pty_open_slave(pty_00);
    if (iVar3 < 0) {
      pty_backend_create_cold_2();
      goto LAB_00113a52;
    }
  }
  pty_00 = pPStackY_10a8;
  close(pPStackY_10a8->master_fd);
  noncloexec(iVar3);
  dup2(iVar3,0);
  dup2(iVar3,1);
  dup2(iVar3,2);
  close(iVar3);
  setsid();
  ioctl(0,0x540e,1);
  tcsetpgrp(0,in_R9D);
  iVar3 = tcgetattr(0,&tStackY_1094);
  lVar8 = lStackY_10c0;
  if (iVar3 == 0) {
    _Var2 = conf_get_bool(oldconf,0x48);
    tStackY_1094.c_cc[2] = '\b';
    if (_Var2) {
      tStackY_1094.c_cc[2] = '\x7f';
    }
    _Var2 = (*pSStackY_10b0->vt->is_utf8)(pSStackY_10b0);
    tStackY_1094.c_iflag = (uint)_Var2 << 0xe | tStackY_1094.c_iflag & 0xffffbfff;
    puVar20 = auStack_1020;
    puVar22 = auStackY_15f0;
    for (lVar18 = 0xa1; lVar18 != 0; lVar18 = lVar18 + -1) {
      *puVar22 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
      puVar22 = puVar22 + (ulong)bVar29 * -2 + 1;
    }
    uStackY_10e8 = uStack_b18;
    copy_ttymodes_into_termios();
    tcsetattr(0,0,&tStackY_1094);
  }
LAB_001136f8:
  setpgid(in_R9D,in_R9D);
  if (((char)uStackY_10d4 == '\0') && (iVar3 = open(pty_00->name,1,0), -1 < iVar3)) {
    close(iVar3);
  }
  setpgid(in_R9D,in_R9D);
  if (puStack_b08 != (undefined8 *)0x0) {
    pcVar11 = (char *)*puStack_b08;
    puVar20 = puStack_b08;
    while (pcVar11 != (char *)0x0) {
      puVar20 = puVar20 + 1;
      unsetenv(pcVar11);
      pcVar11 = (char *)*puVar20;
    }
  }
  if ((char)uStackY_10d4 == '\0') {
    pcVar11 = conf_get_str(oldconf,0x35);
    pcVar11 = dupprintf("TERM=%s",pcVar11);
    putenv(pcVar11);
  }
  pcVar11 = conf_get_str_strs(oldconf,0x38,(char *)0x0,&pcStackY_10b8);
  if (pcVar11 != (char *)0x0) {
    do {
      pcVar11 = dupcat_fn(pcStackY_10b8,"=",pcVar11,0);
      putenv(pcVar11);
      pcVar11 = conf_get_str_strs(oldconf,0x38,pcStackY_10b8,&pcStackY_10b8);
    } while (pcVar11 != (char *)0x0);
  }
  if (pcStack_b10 != (char *)0x0) {
    chdir(pcStack_b10);
  }
  putty_signal(2,(_func_void_int *)0x0);
  putty_signal(3,(_func_void_int *)0x0);
  putty_signal(0xd,(_func_void_int *)0x0);
  block_signal(0xd,false);
  if (ppcStackY_10a0 == (char **)0x0 && lVar8 == 0) {
    pcVar12 = getenv("SHELL");
    pcVar11 = "/bin/sh";
    if (pcVar12 != (char *)0x0) {
      pcVar11 = pcVar12;
    }
    _Var2 = conf_get_bool(oldconf,0xc5);
    pcVar12 = pcVar11;
    if (_Var2) {
      pcVar13 = strrchr(pcVar11,0x2f);
      sVar14 = strlen(pcVar11);
      pcVar12 = (char *)safemalloc(sVar14 + 2,1,0);
      pcVar19 = pcVar13 + 1;
      if (pcVar13 == (char *)0x0) {
        pcVar19 = pcVar11;
      }
      sprintf(pcVar12,"-%s",pcVar19);
    }
    execl(pcVar11,pcVar12,0);
  }
  else {
    if (ppcStackY_10a0 != (char **)0x0) {
      execvp(*ppcStackY_10a0,ppcStackY_10a0);
    }
    if ((lVar8 != 0) && (pcVar11 = getenv("SHELL"), pcVar11 != (char *)0x0)) {
      execl(pcVar11,pcVar11,"-c",lVar8,0);
    }
  }
  perror("exec");
  _exit(0x7f);
}

Assistant:

static void pty_real_select_result(Pty *pty, int fd, int event, int status)
{
    char buf[4096];
    int ret;
    bool finished = false;

    if (event < 0) {
        /*
         * We've been called because our child process did
         * something. `status' tells us what.
         */
        if ((WIFEXITED(status) || WIFSIGNALED(status))) {
            /*
             * The primary child process died.
             */
            pty->child_dead = true;
            del234(ptys_by_pid, pty);
            pty->exit_code = status;

            /*
             * If this is an ordinary pty session, this is also the
             * moment to terminate the whole backend.
             *
             * We _could_ instead keep the terminal open for remaining
             * subprocesses to output to, but conventional wisdom
             * seems to feel that that's the Wrong Thing for an
             * xterm-alike, so we bail out now (though we don't
             * necessarily _close_ the window, depending on the state
             * of Close On Exit). This would be easy enough to change
             * or make configurable if necessary.
             */
            if (pty->master_fd >= 0)
                finished = true;
        }
    } else {
        if (event == SELECT_R) {
            bool is_stdout = (fd == pty->master_o);

            ret = read(fd, buf, sizeof(buf));

            /*
             * Treat EIO on a pty master as equivalent to EOF (because
             * that's how the kernel seems to report the event where
             * the last process connected to the other end of the pty
             * went away).
             */
            if (fd == pty->master_fd && ret < 0 && errno == EIO)
                ret = 0;

            if (ret == 0) {
                /*
                 * EOF on this input fd, so to begin with, we may as
                 * well close it, and remove all references to it in
                 * the pty's fd fields.
                 */
                uxsel_del(fd);
                close(fd);
                if (pty->master_fd == fd)
                    pty->master_fd = -1;
                if (pty->master_o == fd)
                    pty->master_o = -1;
                if (pty->master_e == fd)
                    pty->master_e = -1;

                if (is_stdout) {
                    /*
                     * We assume a clean exit if the pty (or stdout
                     * pipe) has closed, but the actual child process
                     * hasn't. The only way I can imagine this
                     * happening is if it detaches itself from the pty
                     * and goes daemonic - in which case the expected
                     * usage model would precisely _not_ be for the
                     * pterm window to hang around!
                     */
                    finished = true;
                    pty_try_wait(); /* one last effort to collect exit code */
                    if (!pty->child_dead)
                        pty->exit_code = 0;
                }
            } else if (ret < 0) {
                perror("read pty master");
                exit(1);
            } else if (ret > 0) {
                pty->output_backlog = seat_output(
                    pty->seat, !is_stdout, buf, ret);
                pty_uxsel_setup(pty);
            }
        } else if (event == SELECT_W) {
            /*
             * Attempt to send data down the pty.
             */
            pty_try_write(pty);
        }
    }

    if (finished && !pty->finished) {
        int close_on_exit;
        int i;

        for (i = 0; i < 3; i++)
            if (pty->fds[i].fd >= 0)
                uxsel_del(pty->fds[i].fd);

        pty_close(pty);

        pty->finished = true;

        /*
         * This is a slight layering-violation sort of hack: only
         * if we're not closing on exit (COE is set to Never, or to
         * Only On Clean and it wasn't a clean exit) do we output a
         * `terminated' message.
         */
        close_on_exit = conf_get_int(pty->conf, CONF_close_on_exit);
        if (close_on_exit == FORCE_OFF ||
            (close_on_exit == AUTO && pty->exit_code != 0)) {
            char *message;
            if (WIFEXITED(pty->exit_code)) {
                message = dupprintf(
                    "\r\n[pterm: process terminated with exit code %d]\r\n",
                    WEXITSTATUS(pty->exit_code));
            } else if (WIFSIGNALED(pty->exit_code)) {
#if !HAVE_STRSIGNAL
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d]\r\n",
                    WTERMSIG(pty->exit_code));
#else
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d (%s)]\r\n",
                    WTERMSIG(pty->exit_code),
                    strsignal(WTERMSIG(pty->exit_code)));
#endif
            } else {
                /* _Shouldn't_ happen, but if it does, a vague message
                 * is better than no message at all */
                message = dupprintf("\r\n[pterm: process terminated]\r\n");
            }
            seat_stdout_pl(pty->seat, ptrlen_from_asciz(message));
            sfree(message);
        }

        seat_eof(pty->seat);
        seat_notify_remote_exit(pty->seat);
    }
}